

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopUnswitchPass::ProcessFunction(LoopUnswitchPass *this,Function *f)

{
  byte bVar1;
  bool bVar2;
  IRContext *pIVar3;
  Loop *top_node;
  TreeDFIterator<spvtools::opt::Loop> *this_00;
  size_type sVar4;
  reference in_RCX;
  pair<std::__detail::_Node_iterator<spvtools::opt::Loop_*,_true,_false>,_bool> pVar5;
  LoopUtils local_348;
  undefined1 local_328 [8];
  LoopUnswitch unswitcher;
  reference local_2a0;
  reference local_298;
  reference local_290;
  Loop *loop;
  undefined1 local_280 [8];
  TreeDFIterator<spvtools::opt::Loop> __end3;
  TreeDFIterator<spvtools::opt::Loop> __begin3;
  TreeDFIterator<spvtools::opt::Loop> local_178;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_> local_120;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_> *local_70;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_> *__range3;
  LoopDescriptor *pLStack_60;
  bool loop_changed;
  LoopDescriptor *loop_descriptor;
  unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
  processed_loop;
  bool modified;
  Function *f_local;
  LoopUnswitchPass *this_local;
  
  processed_loop._M_h._M_single_bucket._7_1_ = 0;
  std::
  unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
  ::unordered_set((unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
                   *)&loop_descriptor);
  pIVar3 = Pass::context(&this->super_Pass);
  pLStack_60 = IRContext::GetLoopDescriptor(pIVar3,f);
  __range3._7_1_ = 1;
  do {
    bVar1 = processed_loop._M_h._M_single_bucket._7_1_;
    if ((__range3._7_1_ & 1) == 0) {
      loop._4_4_ = 1;
      std::
      unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
      ::~unordered_set((unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
                        *)&loop_descriptor);
      return (bool)(bVar1 & 1);
    }
    __range3._7_1_ = 0;
    top_node = LoopDescriptor::GetPlaceholderRootLoop(pLStack_60);
    TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator(&local_178,top_node);
    this_00 = TreeDFIterator<spvtools::opt::Loop>::operator++(&local_178);
    TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator
              ((TreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__begin3.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    make_range<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>>
              (&local_120,(opt *)this_00,
               (TreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__begin3.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18),
               (TreeDFIterator<spvtools::opt::Loop> *)in_RCX);
    TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator
              ((TreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__begin3.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator(&local_178);
    local_70 = &local_120;
    IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::begin
              ((TreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end3.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18),local_70);
    IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::end
              ((TreeDFIterator<spvtools::opt::Loop> *)local_280,local_70);
    while (bVar2 = TreeDFIterator<spvtools::opt::Loop>::operator!=
                             ((TreeDFIterator<spvtools::opt::Loop> *)
                              ((long)&__end3.parent_iterators_.c.
                                      super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                              (TreeDFIterator<spvtools::opt::Loop> *)local_280), bVar2) {
      local_298 = TreeDFIterator<spvtools::opt::Loop>::operator*
                            ((TreeDFIterator<spvtools::opt::Loop> *)
                             ((long)&__end3.parent_iterators_.c.
                                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      local_290 = local_298;
      sVar4 = std::
              unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
              ::count((unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
                       *)&loop_descriptor,&local_298);
      if (sVar4 == 0) {
        local_2a0 = local_290;
        pVar5 = std::
                unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
                ::insert((unordered_set<spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<spvtools::opt::Loop_*>_>
                          *)&loop_descriptor,&local_2a0);
        unswitcher.ordered_loop_blocks_.
        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)pVar5.first.super__Node_iterator_base<spvtools::opt::Loop_*,_false>._M_cur;
        pIVar3 = Pass::context(&this->super_Pass);
        in_RCX = local_290;
        anon_unknown_0::LoopUnswitch::LoopUnswitch
                  ((LoopUnswitch *)local_328,pIVar3,f,local_290,pLStack_60);
        while (bVar2 = anon_unknown_0::LoopUnswitch::CanUnswitchLoop((LoopUnswitch *)local_328),
              bVar2) {
          bVar2 = Loop::IsLCSSA(local_290);
          if (!bVar2) {
            pIVar3 = Pass::context(&this->super_Pass);
            LoopUtils::LoopUtils(&local_348,pIVar3,local_290);
            LoopUtils::MakeLoopClosedSSA(&local_348);
          }
          processed_loop._M_h._M_single_bucket._7_1_ = 1;
          __range3._7_1_ = 1;
          anon_unknown_0::LoopUnswitch::PerformUnswitch((LoopUnswitch *)local_328);
        }
        if ((__range3._7_1_ & 1) == 0) {
          loop._4_4_ = 0;
        }
        else {
          loop._4_4_ = 4;
        }
        anon_unknown_0::LoopUnswitch::~LoopUnswitch((LoopUnswitch *)local_328);
        if (loop._4_4_ != 0) goto LAB_00a5eee1;
      }
      TreeDFIterator<spvtools::opt::Loop>::operator++
                ((TreeDFIterator<spvtools::opt::Loop> *)
                 ((long)&__end3.parent_iterators_.c.
                         super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    }
    loop._4_4_ = 4;
LAB_00a5eee1:
    TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator
              ((TreeDFIterator<spvtools::opt::Loop> *)local_280);
    TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator
              ((TreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end3.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::~IteratorRange(&local_120);
  } while( true );
}

Assistant:

bool LoopUnswitchPass::ProcessFunction(Function* f) {
  bool modified = false;
  std::unordered_set<Loop*> processed_loop;

  LoopDescriptor& loop_descriptor = *context()->GetLoopDescriptor(f);

  bool loop_changed = true;
  while (loop_changed) {
    loop_changed = false;
    for (Loop& loop : make_range(
             ++TreeDFIterator<Loop>(loop_descriptor.GetPlaceholderRootLoop()),
             TreeDFIterator<Loop>())) {
      if (processed_loop.count(&loop)) continue;
      processed_loop.insert(&loop);

      LoopUnswitch unswitcher(context(), f, &loop, &loop_descriptor);
      while (unswitcher.CanUnswitchLoop()) {
        if (!loop.IsLCSSA()) {
          LoopUtils(context(), &loop).MakeLoopClosedSSA();
        }
        modified = true;
        loop_changed = true;
        unswitcher.PerformUnswitch();
      }
      if (loop_changed) break;
    }
  }

  return modified;
}